

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bacPtr.c
# Opt level: O2

Vec_Ptr_t * Bac_PtrTransformBoxes(Vec_Ptr_t *vBoxes,Vec_Ptr_t *vGatesNames)

{
  Vec_Ptr_t *p;
  Vec_Ptr_t *pVVar1;
  int i;
  
  p = Vec_PtrAllocExact(vBoxes->nSize);
  for (i = 0; i < vBoxes->nSize; i = i + 1) {
    pVVar1 = (Vec_Ptr_t *)Vec_PtrEntry(vBoxes,i);
    pVVar1 = Bac_PtrTransformBox(pVVar1,vGatesNames);
    Vec_PtrPush(p,pVVar1);
  }
  return p;
}

Assistant:

Vec_Ptr_t * Bac_PtrTransformBoxes( Vec_Ptr_t * vBoxes, Vec_Ptr_t * vGatesNames )
{
    Vec_Ptr_t * vBox; int i;
    Vec_Ptr_t * vNew = Vec_PtrAllocExact( Vec_PtrSize(vBoxes) );
    Vec_PtrForEachEntry( Vec_Ptr_t *, vBoxes, vBox, i )
        Vec_PtrPush( vNew, Bac_PtrTransformBox(vBox, vGatesNames) );
    return vNew;
}